

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void __thiscall QPDF::calculateHPageOffset(QPDF *this,NewObjTable *new_obj,ObjTable *obj)

{
  long lVar1;
  int iVar2;
  QPDFObjectHandle *this_00;
  QPDFObjectHandle *pQVar3;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var4;
  pointer pQVar5;
  long lVar6;
  iterator iVar7;
  bool bVar8;
  QPDF *pQVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar13;
  Object *pOVar14;
  NewObject *this_01;
  qpdf_offset_t qVar15;
  pointer pCVar16;
  int *__args;
  int iVar17;
  long lVar18;
  pointer pCVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  Members *pMVar29;
  int local_c4;
  int local_c0;
  allocator_type local_b9;
  long local_b8;
  ulong local_b0;
  Members *local_a8;
  ObjTable *local_a0;
  ObjTable<QPDFWriter::NewObject> *local_98;
  QPDF *local_90;
  string local_88;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_60;
  QPDFObjectHandle local_58;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> local_48;
  
  local_a0 = obj;
  local_98 = &new_obj->super_ObjTable<QPDFWriter::NewObject>;
  pvVar13 = getAllPages(this);
  local_a8 = (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  pCVar16 = *(pointer *)&(local_a8->c_page_offset_data).entries;
  if (*(pointer *)((long)&local_a8->c_page_offset_data + 8) != pCVar16) {
    this_00 = (pvVar13->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pQVar3 = (pvVar13->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    local_b0 = (long)pQVar3 - (long)this_00 >> 4;
    if (pQVar3 == this_00) {
      uVar20 = local_b0;
      uVar25 = 0;
      goto LAB_0021a77b;
    }
    iVar17 = pCVar16->nobjects;
    local_60 = pvVar13;
    iVar10 = QPDFObjectHandle::getObjectID(this_00);
    iVar10 = outputLengthNextN(this,iVar10,iVar17,(NewObjTable *)local_98,local_a0);
    pMVar29 = local_a8;
    pCVar16 = *(pointer *)
               &(local_a8->c_page_offset_data).entries.
                super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                ._M_impl;
    if (*(pointer *)
         ((long)&(local_a8->c_page_offset_data).entries.
                 super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
         + 8) != pCVar16) {
      local_b8 = CONCAT44(local_b8._4_4_,pCVar16->nshared_objects);
      _Var4._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_90 = this;
      std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::vector
                (&local_48,local_b0,&local_b9);
      local_88.field_2._M_allocated_capacity =
           (size_type)*(pointer *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x50);
      *(pointer *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x50) =
           local_48.
           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88._M_dataplus._M_p =
           *(pointer *)
            &((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
             ((long)&(_Var4._M_head_impl)->page_offset_hints + 0x40))->
             super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>;
      local_88._M_string_length =
           *(size_type *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x48);
      *(pointer *)
       &((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
        ((long)&(_Var4._M_head_impl)->page_offset_hints + 0x40))->
        super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> =
           local_48.
           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
           _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x48) =
           local_48.
           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::~vector
                ((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
                 &local_88);
      std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::~vector
                (&local_48);
      pCVar16 = *(pointer *)
                 &(pMVar29->c_page_offset_data).entries.
                  super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                  ._M_impl;
      pCVar19 = *(pointer *)
                 ((long)&(pMVar29->c_page_offset_data).entries.
                         super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                 + 8);
      uVar23 = 1;
      uVar25 = 0;
      local_c4 = iVar17;
      local_c0 = iVar10;
      do {
        uVar20 = (long)pCVar19 - (long)pCVar16 >> 5;
        if (uVar20 <= uVar25) goto LAB_0021a77b;
        pQVar5 = (local_60->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar20 = (long)(local_60->
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pQVar5 >> 4;
        if (uVar20 <= uVar25) goto LAB_0021a77b;
        iVar12 = pCVar16[uVar25].nobjects;
        iVar11 = QPDFObjectHandle::getObjectID(pQVar5 + uVar25);
        iVar11 = outputLengthNextN(local_90,iVar11,iVar12,(NewObjTable *)local_98,local_a0);
        pQVar9 = local_90;
        pCVar16 = (local_a8->c_page_offset_data).entries.
                  super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar19 = (local_a8->c_page_offset_data).entries.
                  super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar20 = (long)pCVar19 - (long)pCVar16 >> 5;
        if (uVar20 <= uVar25) goto LAB_0021a77b;
        lVar24 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                             *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x40))->
                           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
        ;
        uVar20 = ((long)*(pointer *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x48) - lVar24
                 >> 3) * 0x2e8ba2e8ba2e8ba3;
        if (uVar20 < uVar25 || uVar20 - uVar25 == 0) goto LAB_0021a77b;
        iVar2 = pCVar16[uVar25].nshared_objects;
        iVar26 = (uint)local_b8;
        if ((int)(uint)local_b8 <= iVar2) {
          iVar26 = iVar2;
        }
        local_b8 = CONCAT44(local_b8._4_4_,iVar26);
        if (local_c0 <= iVar11) {
          local_c0 = iVar11;
        }
        if (iVar11 < iVar10) {
          iVar10 = iVar11;
        }
        if (iVar17 <= iVar12) {
          iVar17 = iVar12;
        }
        if (iVar12 < local_c4) {
          local_c4 = iVar12;
        }
        lVar27 = uVar25 * 0x58;
        *(int *)(lVar24 + lVar27) = iVar12;
        *(long *)(lVar24 + 8 + lVar27) = (long)iVar11;
        *(int *)(lVar24 + 0x10 + lVar27) = iVar2;
        uVar25 = (ulong)uVar23;
        uVar23 = uVar23 + 1;
      } while (uVar25 < local_b0);
      ((_Var4._M_head_impl)->page_offset_hints).min_nobjects = local_c4;
      pQVar5 = (local_60->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((local_60->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
          _M_impl.super__Vector_impl_data._M_finish != pQVar5) {
        local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (pQVar5->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (pQVar5->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_58.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_58.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_58.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_58.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        iVar12 = QPDFObjectHandle::getObjectID(&local_58);
        pOVar14 = ObjTable<QPDFWriter::Object>::element
                            (&local_a0->super_ObjTable<QPDFWriter::Object>,(long)iVar12);
        this_01 = ObjTable<QPDFWriter::NewObject>::element(local_98,(long)pOVar14->renumber);
        qVar15 = QPDFXRefEntry::getOffset(&this_01->xref);
        *(qpdf_offset_t *)((long)&(_Var4._M_head_impl)->page_offset_hints + 8) = qVar15;
        if (local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        iVar12 = 0;
        iVar11 = 0;
        if (iVar17 - local_c4 != 0) {
          iVar11 = 0;
          uVar23 = iVar17 - local_c4;
          do {
            iVar11 = iVar11 + 1;
            bVar8 = 1 < uVar23;
            uVar23 = (int)uVar23 >> 1;
          } while (bVar8);
        }
        *(int *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x10) = iVar11;
        *(int *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x14) = iVar10;
        if (local_c0 - iVar10 != 0) {
          iVar12 = 0;
          uVar23 = local_c0 - iVar10;
          do {
            iVar12 = iVar12 + 1;
            bVar8 = 1 < uVar23;
            uVar23 = (int)uVar23 >> 1;
          } while (bVar8);
        }
        *(int *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x18) = iVar12;
        iVar17 = 0;
        iVar11 = 0;
        if ((uint)local_b8 != 0) {
          iVar11 = 0;
          do {
            iVar11 = iVar11 + 1;
            bVar8 = 1 < (uint)local_b8;
            local_b8._0_4_ = (int)(uint)local_b8 >> 1;
          } while (bVar8);
        }
        *(int *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x2c) = iVar11;
        uVar23 = *(int *)((long)&((pQVar9->m)._M_t.
                                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                  .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                 c_shared_object_data + 8);
        if (uVar23 != 0) {
          iVar17 = 0;
          do {
            iVar17 = iVar17 + 1;
            bVar8 = 1 < uVar23;
            uVar23 = (int)uVar23 >> 1;
          } while (bVar8);
        }
        *(int *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x30) = iVar17;
        *(int *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x38) = 4;
        *(int *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x28) = iVar12;
        *(int *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x24) = iVar10;
        local_b8 = (long)iVar10;
        local_b0 = local_b0 + (local_b0 == 0);
        uVar28 = 0;
        pMVar29 = local_a8;
        while( true ) {
          lVar24 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                               *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x40))->
                             super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
          ;
          uVar20 = ((long)*(pointer *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x48) -
                    lVar24 >> 3) * 0x2e8ba2e8ba2e8ba3;
          uVar25 = uVar28;
          if (uVar20 < uVar28 || uVar20 - uVar28 == 0) break;
          lVar27 = uVar28 * 0x58;
          if ((*(int *)(lVar24 + lVar27) < local_c4) || (*(long *)(lVar24 + lVar27 + 8) < local_b8))
          {
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,
                       "found too small delta nobjects or delta page length while writing linearization data"
                       ,"");
            stopOnError(local_90,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,
                              (ulong)(local_88.field_2._M_allocated_capacity + 1));
            }
            lVar24 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                                 *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x40))->
                               super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
            ;
            uVar20 = ((long)*(pointer *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x48) -
                      lVar24 >> 3) * 0x2e8ba2e8ba2e8ba3;
          }
          if (uVar20 <= uVar28) break;
          *(int *)(lVar24 + lVar27) = *(int *)(lVar24 + lVar27) - local_c4;
          lVar18 = *(long *)(lVar24 + 8 + lVar27) - local_b8;
          *(long *)(lVar24 + 8 + lVar27) = lVar18;
          *(long *)(lVar24 + 0x50 + lVar27) = lVar18;
          pCVar16 = (pMVar29->c_page_offset_data).entries.
                    super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar20 = (long)(pMVar29->c_page_offset_data).entries.
                         super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar16 >> 5;
          if (uVar20 <= uVar28) break;
          lVar24 = 0;
          uVar22 = 0;
          while( true ) {
            iVar17 = pCVar16[uVar28].nshared_objects;
            if (iVar17 < 0) {
              QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar17);
              iVar17 = pCVar16[uVar28].nshared_objects;
              pMVar29 = local_a8;
            }
            if ((ulong)(long)iVar17 <= uVar22) break;
            lVar18 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                                 *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x40))->
                               super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
            ;
            uVar21 = ((long)*(pointer *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x48) -
                      lVar18 >> 3) * 0x2e8ba2e8ba2e8ba3;
            uVar20 = uVar21;
            uVar25 = uVar28;
            if (uVar21 < uVar28 || uVar21 - uVar28 == 0) goto LAB_0021a77b;
            pCVar16 = (pMVar29->c_page_offset_data).entries.
                      super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar20 = (long)(pMVar29->c_page_offset_data).entries.
                           super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar16 >> 5;
            if (uVar20 <= uVar28) goto LAB_0021a77b;
            lVar6 = *(long *)&pCVar16[uVar28].shared_identifiers.
                              super__Vector_base<int,_std::allocator<int>_>;
            uVar20 = (long)*(pointer *)
                            ((long)&pCVar16[uVar28].shared_identifiers.
                                    super__Vector_base<int,_std::allocator<int>_> + 8) - lVar6 >> 2;
            uVar25 = uVar22;
            if (uVar20 <= uVar22) goto LAB_0021a77b;
            lVar1 = lVar18 + lVar27;
            __args = (int *)(lVar6 + lVar24);
            iVar7._M_current = *(int **)(lVar1 + 0x20);
            if (iVar7._M_current == *(int **)(lVar1 + 0x28)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)(lVar1 + 0x18),iVar7,__args);
              lVar18 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                                   *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x40))->
                                 super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
              ;
              uVar21 = ((long)*(pointer *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x48) -
                        lVar18 >> 3) * 0x2e8ba2e8ba2e8ba3;
            }
            else {
              *iVar7._M_current = *__args;
              *(int **)(lVar1 + 0x20) = iVar7._M_current + 1;
            }
            uVar20 = uVar21;
            uVar25 = uVar28;
            if (uVar21 <= uVar28) goto LAB_0021a77b;
            lVar18 = lVar18 + lVar27;
            local_88._M_dataplus._M_p = local_88._M_dataplus._M_p & 0xffffffff00000000;
            iVar7._M_current = *(int **)(lVar18 + 0x38);
            if (iVar7._M_current == *(int **)(lVar18 + 0x40)) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)(lVar18 + 0x30),iVar7,(int *)&local_88
                        );
            }
            else {
              *iVar7._M_current = 0;
              *(int **)(lVar18 + 0x38) = iVar7._M_current + 1;
            }
            uVar22 = uVar22 + 1;
            pCVar16 = (pMVar29->c_page_offset_data).entries.
                      super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar20 = (long)(pMVar29->c_page_offset_data).entries.
                           super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar16 >> 5;
            lVar24 = lVar24 + 4;
            if (uVar20 <= uVar28) goto LAB_0021a77b;
          }
          uVar28 = uVar28 + 1;
          if (uVar28 == local_b0) {
            return;
          }
        }
        goto LAB_0021a77b;
      }
    }
  }
  uVar20 = 0;
  uVar25 = 0;
LAB_0021a77b:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar25,
             uVar20);
}

Assistant:

void
QPDF::calculateHPageOffset(QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    // Page Offset Hint Table

    // We are purposely leaving some values set to their initial zero values.

    std::vector<QPDFObjectHandle> const& pages = getAllPages();
    size_t npages = pages.size();
    CHPageOffset& cph = m->c_page_offset_data;
    std::vector<CHPageOffsetEntry>& cphe = cph.entries;

    // Calculate minimum and maximum values for number of objects per page and page length.

    int min_nobjects = cphe.at(0).nobjects;
    int max_nobjects = min_nobjects;
    int min_length = outputLengthNextN(pages.at(0).getObjectID(), min_nobjects, new_obj, obj);
    int max_length = min_length;
    int max_shared = cphe.at(0).nshared_objects;

    HPageOffset& ph = m->page_offset_hints;
    std::vector<HPageOffsetEntry>& phe = ph.entries;
    // npages is the size of the existing pages array.
    phe = std::vector<HPageOffsetEntry>(npages);

    for (unsigned int i = 0; i < npages; ++i) {
        // Calculate values for each page, assigning full values to the delta items.  They will be
        // adjusted later.

        // Repeat calculations for page 0 so we can assign to phe[i] without duplicating those
        // assignments.

        int nobjects = cphe.at(i).nobjects;
        int length = outputLengthNextN(pages.at(i).getObjectID(), nobjects, new_obj, obj);
        int nshared = cphe.at(i).nshared_objects;

        min_nobjects = std::min(min_nobjects, nobjects);
        max_nobjects = std::max(max_nobjects, nobjects);
        min_length = std::min(min_length, length);
        max_length = std::max(max_length, length);
        max_shared = std::max(max_shared, nshared);

        phe.at(i).delta_nobjects = nobjects;
        phe.at(i).delta_page_length = length;
        phe.at(i).nshared_objects = nshared;
    }

    ph.min_nobjects = min_nobjects;
    ph.first_page_offset = new_obj[obj[pages.at(0)].renumber].xref.getOffset();
    ph.nbits_delta_nobjects = nbits(max_nobjects - min_nobjects);
    ph.min_page_length = min_length;
    ph.nbits_delta_page_length = nbits(max_length - min_length);
    ph.nbits_nshared_objects = nbits(max_shared);
    ph.nbits_shared_identifier = nbits(m->c_shared_object_data.nshared_total);
    ph.shared_denominator = 4; // doesn't matter

    // It isn't clear how to compute content offset and content length.  Since we are not
    // interleaving page objects with the content stream, we'll use the same values for content
    // length as page length.  We will use 0 as content offset because this is what Adobe does
    // (implementation note 127) and pdlin as well.
    ph.nbits_delta_content_length = ph.nbits_delta_page_length;
    ph.min_content_length = ph.min_page_length;

    for (size_t i = 0; i < npages; ++i) {
        // Adjust delta entries
        if ((phe.at(i).delta_nobjects < min_nobjects) ||
            (phe.at(i).delta_page_length < min_length)) {
            stopOnError(
                "found too small delta nobjects or delta page length while writing "
                "linearization data");
        }
        phe.at(i).delta_nobjects -= min_nobjects;
        phe.at(i).delta_page_length -= min_length;
        phe.at(i).delta_content_length = phe.at(i).delta_page_length;

        for (size_t j = 0; j < toS(cphe.at(i).nshared_objects); ++j) {
            phe.at(i).shared_identifiers.push_back(cphe.at(i).shared_identifiers.at(j));
            phe.at(i).shared_numerators.push_back(0);
        }
    }
}